

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyImageToBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  Allocator *pAVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  long lVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *pUVar10
  ;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Operation *pOVar14;
  TextureFormat TVar15;
  Buffer *pBVar16;
  Image *this_00;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *pUVar17;
  ulong uVar18;
  _func_int **bufferSize;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  local_a8;
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
  *local_98;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_90;
  VkImageCreateInfo local_88;
  
  local_90 = __return_storage_ptr__;
  if (this->m_mode == ACCESS_MODE_READ) {
    pOVar14 = (Operation *)operator_new(0x30);
    pOVar14->_vptr_Operation = (_func_int **)&PTR__ReadImplementation_00d65f90;
    pOVar14[1]._vptr_Operation = (_func_int **)context;
    pOVar14[2]._vptr_Operation = (_func_int **)resource;
    pOVar14[3]._vptr_Operation = (_func_int **)0x0;
    pUVar17 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar14 + 3);
    TVar15 = ::vk::mapVkFormat((resource->m_imageData).format);
    iVar13 = tcu::getPixelSize(TVar15);
    bufferSize = (_func_int **)
                 (ulong)(iVar13 * (resource->m_imageData).extent.width *
                         (resource->m_imageData).extent.height *
                        (resource->m_imageData).extent.depth);
    pOVar14[5]._vptr_Operation = bufferSize;
    pp_Var4 = pOVar14[1]._vptr_Operation;
    pDVar1 = (DeviceInterface *)pp_Var4[1];
    pVVar2 = (VkDevice)pp_Var4[3];
    pAVar3 = (Allocator *)pp_Var4[4];
    pBVar16 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,(VkDeviceSize)bufferSize,2);
    synchronization::Buffer::Buffer
              (pBVar16,pDVar1,pVVar2,pAVar3,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((pUVar17->m_data).ptr != pBVar16) {
      de::details::
      UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
      reset(pUVar17);
      (pUVar17->m_data).ptr = pBVar16;
    }
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&local_a8);
    p_Var5 = pOVar14[3]._vptr_Operation[4];
    memset(*(void **)(p_Var5 + 0x18),0,(size_t)pOVar14[5]._vptr_Operation);
    ::vk::flushMappedMemoryRange
              (pDVar1,pVVar2,(VkDeviceMemory)*(deUint64 *)(p_Var5 + 8),
               *(VkDeviceSize *)(p_Var5 + 0x10),(VkDeviceSize)pOVar14[5]._vptr_Operation);
  }
  else {
    pOVar14 = (Operation *)operator_new(0x70);
    pOVar14->_vptr_Operation = (_func_int **)&PTR__WriteImplementation_00d65fe0;
    pOVar14[1]._vptr_Operation = (_func_int **)context;
    pOVar14[2]._vptr_Operation = (_func_int **)resource;
    pOVar14[3]._vptr_Operation = (_func_int **)0x1;
    pOVar14[4]._vptr_Operation = (_func_int **)0x1;
    *(undefined4 *)&pOVar14[5]._vptr_Operation = 1;
    *(undefined8 *)((long)&pOVar14[5]._vptr_Operation + 4) = 1;
    *(undefined8 *)((long)&pOVar14[6]._vptr_Operation + 4) = 0x100000000;
    pUVar17 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar14 + 8);
    pOVar14[8]._vptr_Operation = (_func_int **)0x0;
    local_98 = (UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)(pOVar14 + 10);
    pOVar14[10]._vptr_Operation = (_func_int **)0x0;
    pDVar1 = context->m_vk;
    pVVar2 = context->m_device;
    pAVar3 = context->m_allocator;
    TVar15 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    uVar11 = tcu::getPixelSize(TVar15);
    pp_Var4 = pOVar14[2]._vptr_Operation;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pp_Var4[5];
    uVar12 = SUB164(auVar8 / ZEXT416(uVar11),0);
    uVar9 = 0x1000;
    if (uVar12 < 0x1000) {
      uVar9 = uVar12;
    }
    pOVar14[0xc]._vptr_Operation =
         (_func_int **)
         CONCAT44(((uVar12 >> 0xc) + 1) -
                  (uint)((auVar8 / ZEXT416(uVar11) & (undefined1  [16])0xfff) ==
                        (undefined1  [16])0x0),uVar9);
    *(undefined4 *)&pOVar14[0xd]._vptr_Operation = 1;
    pBVar16 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,(VkDeviceSize)pp_Var4[5],1);
    synchronization::Buffer::Buffer
              (pBVar16,pDVar1,pVVar2,pAVar3,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((pUVar17->m_data).ptr != pBVar16) {
      de::details::
      UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
      reset(pUVar17);
      (pUVar17->m_data).ptr = pBVar16;
    }
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&local_a8);
    p_Var5 = pOVar14[8]._vptr_Operation[4];
    p_Var6 = pOVar14[2]._vptr_Operation[5];
    if (p_Var6 != (_func_int *)0x0) {
      lVar7 = *(long *)(p_Var5 + 0x18);
      uVar18 = 0;
      do {
        *(undefined1 *)(lVar7 + uVar18) =
             (&synchronization::(anonymous_namespace)::fillPattern(void*,unsigned_long)::pattern)
             [uVar18 % 0xb];
        uVar18 = uVar18 + 1;
      } while ((_func_int *)(uVar18 & 0xffffffff) < p_Var6);
    }
    ::vk::flushMappedMemoryRange
              (pDVar1,pVVar2,(VkDeviceMemory)*(deUint64 *)(p_Var5 + 8),
               *(VkDeviceSize *)(p_Var5 + 0x10),(VkDeviceSize)pOVar14[2]._vptr_Operation[5]);
    this_00 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,VK_IMAGE_TYPE_2D,(VkExtent3D *)(pOVar14 + 0xc),
                        VK_FORMAT_R8G8B8A8_UNORM,3);
    synchronization::Image::Image(this_00,pDVar1,pVVar2,pAVar3,&local_88,(MemoryRequirement)0x0);
    pUVar10 = local_98;
    local_a8.m_data.ptr = (Buffer *)0x0;
    if ((local_98->m_data).ptr != this_00) {
      de::details::
      UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
      reset(local_98);
      (pUVar10->m_data).ptr = this_00;
    }
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
              ((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                *)&local_a8);
  }
  (local_90->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar14;
  return local_90;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_mode == ACCESS_MODE_READ)
			return de::MovePtr<Operation>(new ReadImplementation(context, resource));
		else
			return de::MovePtr<Operation>(new WriteImplementation(context, resource));
	}